

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::KNearestNeighborsClassifier::MergePartialFromCodedStream
          (KNearestNeighborsClassifier *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  uint32 uVar6;
  NearestNeighborsIndex *value;
  string *value_00;
  undefined8 *puVar7;
  UniformWeighting *value_01;
  Int64Parameter *value_02;
  Int64Vector *value_03;
  StringVector *value_04;
  InverseDistanceWeighting *value_05;
  char cVar8;
  ulong uVar9;
  
LAB_001a5c90:
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar9 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar5 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar6 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar6 = uVar5, (~(uint)*pbVar1 & uVar5) < 0x80))
        goto LAB_001a5ead;
        uVar9 = (ulong)((uVar5 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar9 = uVar9 | 0x100000000;
    }
    else {
LAB_001a5ead:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar9 = 0;
      if (uVar6 - 1 < 0x3fff) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar6 | uVar9;
    }
    uVar6 = (uint32)uVar9;
    if ((uVar9 & 0x100000000) != 0) {
      uVar5 = (uint)(uVar9 >> 3) & 0x1fffffff;
      cVar8 = (char)uVar9;
      if (uVar5 == 0xd2) {
        if (cVar8 != -0x6e) goto LAB_001a5ced;
        value_05 = mutable_inversedistanceweighting(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::InverseDistanceWeighting>
                          (input,value_05);
        goto LAB_001a5d0e;
      }
      if (uVar5 == 3) {
        if (cVar8 != '\x1a') goto LAB_001a5ced;
        value_02 = mutable_numberofneighbors(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::Int64Parameter>(input,value_02);
        goto LAB_001a5d0e;
      }
      if (uVar5 == 100) {
        if (cVar8 != '\"') goto LAB_001a5ced;
        value_04 = mutable_stringclasslabels(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::StringVector>(input,value_04);
        goto LAB_001a5d0e;
      }
      if (uVar5 == 0x65) {
        if (cVar8 != '*') goto LAB_001a5ced;
        value_03 = mutable_int64classlabels(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::Int64Vector>(input,value_03);
        goto LAB_001a5d0e;
      }
      if (uVar5 == 0x6e) {
        if (cVar8 != 'r') goto LAB_001a5ced;
        value_00 = mutable_defaultstringlabel_abi_cxx11_(this);
        bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,value_00);
        if (!bVar4) {
          return false;
        }
        puVar7 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
        if (this->_oneof_case_[1] == 0x6e) {
          puVar7 = (undefined8 *)(this->DefaultClassLabel_).defaultint64label_;
        }
        bVar4 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          ((char *)*puVar7,*(int *)(puVar7 + 1),PARSE,
                           "CoreML.Specification.KNearestNeighborsClassifier.defaultStringLabel");
        if (!bVar4) {
          return false;
        }
      }
      else {
        if (uVar5 != 0x6f) {
          if (uVar5 == 200) {
            if (cVar8 != 'B') goto LAB_001a5ced;
            value_01 = mutable_uniformweighting(this);
            bVar4 = google::protobuf::internal::WireFormatLite::
                    ReadMessageNoVirtual<CoreML::Specification::UniformWeighting>(input,value_01);
          }
          else {
            if ((uVar5 != 1) || (cVar8 != '\n')) goto LAB_001a5ced;
            value = mutable_nearestneighborsindex(this);
            bVar4 = google::protobuf::internal::WireFormatLite::
                    ReadMessageNoVirtual<CoreML::Specification::NearestNeighborsIndex>(input,value);
          }
          goto LAB_001a5d0e;
        }
        if (cVar8 != 'x') goto LAB_001a5ced;
        clear_DefaultClassLabel(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (input,&(this->DefaultClassLabel_).defaultint64label_);
        if (!bVar4) {
          return false;
        }
        this->_oneof_case_[1] = 0x6f;
      }
      goto LAB_001a5c90;
    }
LAB_001a5ced:
    if (uVar6 == 0) {
      return true;
    }
    if ((uVar6 & 7) == 4) {
      return true;
    }
    bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
LAB_001a5d0e:
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool KNearestNeighborsClassifier::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.KNearestNeighborsClassifier)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.NearestNeighborsIndex nearestNeighborsIndex = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_nearestneighborsindex()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Parameter numberOfNeighbors = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_numberofneighbors()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringclasslabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64classlabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string defaultStringLabel = 110;
      case 110: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(882u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_defaultstringlabel()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->defaultstringlabel().data(), this->defaultstringlabel().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.KNearestNeighborsClassifier.defaultStringLabel"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int64 defaultInt64Label = 111;
      case 111: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(888u)) {
          clear_DefaultClassLabel();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &DefaultClassLabel_.defaultint64label_)));
          set_has_defaultint64label();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.UniformWeighting uniformWeighting = 200;
      case 200: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1602u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_uniformweighting()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.InverseDistanceWeighting inverseDistanceWeighting = 210;
      case 210: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1682u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_inversedistanceweighting()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.KNearestNeighborsClassifier)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.KNearestNeighborsClassifier)
  return false;
#undef DO_
}